

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShaderGenerator.cpp
# Opt level: O0

void rsg::anon_unknown_27::genFragmentPassthrough(GeneratorState *state,Shader *shader)

{
  ConstValueRangeAccess value;
  deBool dVar1;
  VariableManager *pVVar2;
  char *name;
  TestError *this;
  Variable *pVVar3;
  VariableType *type;
  Function *this_00;
  BlockStatement *block;
  ConstValueRangeAccess local_50;
  Variable *local_38;
  Variable *inColorVariable;
  ValueEntry *local_20;
  ValueEntry *fragColorEntry;
  Shader *shader_local;
  GeneratorState *state_local;
  
  fragColorEntry = (ValueEntry *)shader;
  shader_local = (Shader *)state;
  pVVar2 = GeneratorState::getVariableManager(state);
  name = getFragColorName((GeneratorState *)shader_local);
  local_20 = findByName(pVVar2,name);
  while( true ) {
    dVar1 = ::deGetFalse();
    if ((dVar1 != 0) || (local_20 == (ValueEntry *)0x0)) break;
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      pVVar2 = GeneratorState::getVariableManager((GeneratorState *)shader_local);
      pVVar3 = ValueEntry::getVariable(local_20);
      type = Variable::getType(pVVar3);
      local_38 = VariableManager::allocate(pVVar2,type,STORAGE_SHADER_IN,"v_color");
      pVVar2 = GeneratorState::getVariableManager((GeneratorState *)shader_local);
      pVVar3 = local_38;
      ValueEntry::getValueRange(&local_50,local_20);
      value.m_min = local_50.m_min;
      value.m_type = local_50.m_type;
      value.m_max = local_50.m_max;
      VariableManager::setValue(pVVar2,pVVar3,value);
      this_00 = Shader::getMain((Shader *)fragColorEntry);
      block = Function::getBody(this_00);
      pVVar3 = ValueEntry::getVariable(local_20);
      createAssignment(block,pVVar3,local_38);
      return;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"fragColorEntry",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgShaderGenerator.cpp"
             ,0x80);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void genFragmentPassthrough (GeneratorState& state, Shader& shader)
{
	// Add simple gl_FragColor = v_color; assignment
	const ValueEntry* fragColorEntry = findByName(state.getVariableManager(), getFragColorName(state));
	TCU_CHECK(fragColorEntry);

	Variable* inColorVariable = state.getVariableManager().allocate(fragColorEntry->getVariable()->getType(), Variable::STORAGE_SHADER_IN, "v_color");

	state.getVariableManager().setValue(inColorVariable, fragColorEntry->getValueRange());
	createAssignment(shader.getMain().getBody(), fragColorEntry->getVariable(), inColorVariable);
}